

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

bool __thiscall Imf_3_2::ChannelList::operator==(ChannelList *this,ChannelList *other)

{
  bool bVar1;
  Channel *other_00;
  ConstIterator j;
  ConstIterator i;
  uint7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar2;
  Channel *in_stack_ffffffffffffffa0;
  bool local_51;
  
  begin((ChannelList *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  begin((ChannelList *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  while( true ) {
    end((ChannelList *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffffa0,
                                (ConstIterator *)
                                CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    local_51 = false;
    if (bVar1) {
      end((ChannelList *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      local_51 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffffa0,
                                     (ConstIterator *)
                                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
    if (local_51 == false) break;
    in_stack_ffffffffffffffa0 = ConstIterator::channel((ConstIterator *)0x174534);
    other_00 = ConstIterator::channel((ConstIterator *)0x174543);
    bVar1 = Channel::operator==(in_stack_ffffffffffffffa0,other_00);
    if (!bVar1) {
      return false;
    }
    ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffffa0);
    ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffffa0);
  }
  end((ChannelList *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = Imf_3_2::operator==((ConstIterator *)in_stack_ffffffffffffffa0,
                              (ConstIterator *)
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  uVar2 = 0;
  if (!bVar1) {
    return false;
  }
  end((ChannelList *)(ulong)in_stack_ffffffffffffff98);
  bVar1 = Imf_3_2::operator==((ConstIterator *)in_stack_ffffffffffffffa0,
                              (ConstIterator *)CONCAT17(uVar2,in_stack_ffffffffffffff98));
  return bVar1;
}

Assistant:

bool
ChannelList::operator== (const ChannelList& other) const
{
    ConstIterator i = begin ();
    ConstIterator j = other.begin ();

    while (i != end () && j != other.end ())
    {
        if (!(i.channel () == j.channel ())) return false;

        ++i;
        ++j;
    }

    return i == end () && j == other.end ();
}